

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::printOpenHeader(ConsoleReporter *this,string *_name)

{
  ulong in_RAX;
  ostream *poVar1;
  ulong uStack_18;
  Colour colourGuard;
  
  if (getLineOfChars<(char)45>()::line == '\0') {
    uRam0000000000184120 = 0x2d2d2d2d2d2d2d;
    uRam0000000000184127._0_1_ = '-';
    uRam0000000000184127._1_1_ = '-';
    uRam0000000000184127._2_1_ = '-';
    uRam0000000000184127._3_1_ = '-';
    uRam0000000000184127._4_1_ = '-';
    uRam0000000000184127._5_1_ = '-';
    uRam0000000000184127._6_1_ = '-';
    uRam0000000000184127._7_1_ = '-';
    DAT_00184110 = '-';
    DAT_00184110_1._0_1_ = '-';
    DAT_00184110_1._1_1_ = '-';
    DAT_00184110_1._2_1_ = '-';
    DAT_00184110_1._3_1_ = '-';
    DAT_00184110_1._4_1_ = '-';
    DAT_00184110_1._5_1_ = '-';
    DAT_00184110_1._6_1_ = '-';
    uRam0000000000184118 = 0x2d2d2d2d2d2d2d;
    DAT_0018411f = 0x2d;
    DAT_00184100 = '-';
    DAT_00184100_1._0_1_ = '-';
    DAT_00184100_1._1_1_ = '-';
    DAT_00184100_1._2_1_ = '-';
    DAT_00184100_1._3_1_ = '-';
    DAT_00184100_1._4_1_ = '-';
    DAT_00184100_1._5_1_ = '-';
    DAT_00184100_1._6_1_ = '-';
    uRam0000000000184108._0_1_ = '-';
    uRam0000000000184108._1_1_ = '-';
    uRam0000000000184108._2_1_ = '-';
    uRam0000000000184108._3_1_ = '-';
    uRam0000000000184108._4_1_ = '-';
    uRam0000000000184108._5_1_ = '-';
    uRam0000000000184108._6_1_ = '-';
    uRam0000000000184108._7_1_ = '-';
    DAT_001840f0 = '-';
    DAT_001840f0_1._0_1_ = '-';
    DAT_001840f0_1._1_1_ = '-';
    DAT_001840f0_1._2_1_ = '-';
    DAT_001840f0_1._3_1_ = '-';
    DAT_001840f0_1._4_1_ = '-';
    DAT_001840f0_1._5_1_ = '-';
    DAT_001840f0_1._6_1_ = '-';
    uRam00000000001840f8._0_1_ = '-';
    uRam00000000001840f8._1_1_ = '-';
    uRam00000000001840f8._2_1_ = '-';
    uRam00000000001840f8._3_1_ = '-';
    uRam00000000001840f8._4_1_ = '-';
    uRam00000000001840f8._5_1_ = '-';
    uRam00000000001840f8._6_1_ = '-';
    uRam00000000001840f8._7_1_ = '-';
    getLineOfChars<(char)45>()::line = '-';
    getLineOfChars<(char)45>()::line_1._0_1_ = '-';
    getLineOfChars<(char)45>()::line_1._1_1_ = '-';
    getLineOfChars<(char)45>()::line_1._2_1_ = '-';
    getLineOfChars<(char)45>()::line_1._3_1_ = '-';
    getLineOfChars<(char)45>()::line_1._4_1_ = '-';
    getLineOfChars<(char)45>()::line_1._5_1_ = '-';
    getLineOfChars<(char)45>()::line_1._6_1_ = '-';
    uRam00000000001840e8._0_1_ = '-';
    uRam00000000001840e8._1_1_ = '-';
    uRam00000000001840e8._2_1_ = '-';
    uRam00000000001840e8._3_1_ = '-';
    uRam00000000001840e8._4_1_ = '-';
    uRam00000000001840e8._5_1_ = '-';
    uRam00000000001840e8._6_1_ = '-';
    uRam00000000001840e8._7_1_ = '-';
    DAT_0018412f = 0;
  }
  uStack_18 = in_RAX;
  poVar1 = std::operator<<((this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream,
                           &getLineOfChars<(char)45>()::line);
  std::operator<<(poVar1,'\n');
  uStack_18 = uStack_18 & 0xffffffffffffff;
  Colour::use(Headers);
  printHeaderString(this,_name,0);
  Colour::~Colour(&colourGuard);
  return;
}

Assistant:

void ConsoleReporter::printOpenHeader(std::string const& _name) {
    stream << getLineOfChars<'-'>() << '\n';
    {
        Colour colourGuard(Colour::Headers);
        printHeaderString(_name);
    }
}